

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter_11.cpp
# Opt level: O0

FileType * prompt_filename_abi_cxx11_(FileType *type)

{
  ostream *poVar1;
  int *in_RSI;
  char *pcVar2;
  FileType *type_local;
  string *filename;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Please enter the name of the ");
  pcVar2 = "out";
  if (*in_RSI == 0) {
    pcVar2 = "in";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1," file: ");
  std::__cxx11::string::string((string *)type);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)type);
  return type;
}

Assistant:

std::string prompt_filename(const FileType& type)
{
	std::cout << "Please enter the name of the "
		<< (type == FileType::in ? "in" : "out")
		<< " file: ";
	std::string filename;
	std::getline(std::cin, filename);
	return filename;
}